

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void prvTidyPPrintXMLTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  ulong uVar1;
  bool bVar2;
  Bool BVar3;
  uint local_48;
  uint cindent;
  Bool mixed;
  Node *content_1;
  Node *pNStack_30;
  uint spaces;
  Node *content;
  Bool xhtmlOut;
  Node *node_local;
  uint indent_local;
  uint mode_local;
  TidyDocImpl *doc_local;
  
  uVar1 = (doc->config).value[0x61].v;
  if (node != (Node *)0x0) {
    if (doc->progressCallback != (TidyPPProgress)0x0) {
      (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
    }
    if (node->type == TextNode) {
      PPrintText(doc,mode,indent,node);
    }
    else if (node->type == CommentTag) {
      PCondFlushLineSmart(doc,indent);
      PPrintComment(doc,indent,node);
    }
    else if (node->type == RootNode) {
      for (pNStack_30 = node->content; pNStack_30 != (Node *)0x0; pNStack_30 = pNStack_30->next) {
        prvTidyPPrintXMLTree(doc,mode,indent,pNStack_30);
      }
    }
    else if (node->type == DocTypeTag) {
      PPrintDocType(doc,indent,node);
    }
    else if (node->type == ProcInsTag) {
      PPrintPI(doc,indent,node);
    }
    else if (node->type == XmlDecl) {
      PPrintXmlDecl(doc,indent,node);
    }
    else if (node->type == CDATATag) {
      PPrintCDATA(doc,indent,node);
    }
    else if (node->type == SectionTag) {
      PPrintSection(doc,indent,node);
    }
    else if (node->type == AspTag) {
      PPrintAsp(doc,indent,node);
    }
    else if (node->type == JsteTag) {
      PPrintJste(doc,indent,node);
    }
    else if (node->type == PhpTag) {
      PPrintPhp(doc,indent,node);
    }
    else {
      BVar3 = prvTidynodeHasCM(node,1);
      if ((BVar3 == no) && ((node->type != StartEndTag || ((int)uVar1 != 0)))) {
        uVar1 = (doc->config).value[0x26].v;
        bVar2 = false;
        for (_cindent = node->content; _cindent != (Node *)0x0; _cindent = _cindent->next) {
          BVar3 = prvTidynodeIsText(_cindent);
          if (BVar3 != no) {
            bVar2 = true;
            break;
          }
        }
        PCondFlushLineSmart(doc,indent);
        BVar3 = prvTidyXMLPreserveWhiteSpace(doc,node);
        if (BVar3 == no) {
          local_48 = indent;
          node_local._0_4_ = indent;
          if (!bVar2) {
            local_48 = indent + (int)uVar1;
          }
        }
        else {
          node_local._0_4_ = 0;
          bVar2 = false;
          local_48 = 0;
        }
        PPrintTag(doc,mode,(uint)node_local,node);
        if ((!bVar2) && (node->content != (Node *)0x0)) {
          prvTidyPFlushLineSmart(doc,local_48);
        }
        for (_cindent = node->content; _cindent != (Node *)0x0; _cindent = _cindent->next) {
          prvTidyPPrintXMLTree(doc,mode,local_48,_cindent);
        }
        if ((!bVar2) && (node->content != (Node *)0x0)) {
          PCondFlushLineSmart(doc,(uint)node_local);
        }
        PPrintEndTag(doc,mode,(uint)node_local,node);
      }
      else {
        PCondFlushLineSmart(doc,indent);
        PPrintTag(doc,mode,indent,node);
      }
    }
  }
  return;
}

Assistant:

void TY_(PPrintXMLTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    if (node == NULL)
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }
    
    if ( node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PCondFlushLineSmart( doc, indent );
        PPrintComment( doc, indent, node);
        /* PCondFlushLine( doc, 0 ); */
    }
    else if ( node->type == RootNode )
    {
        Node *content;
        for ( content = node->content;
              content != NULL;
              content = content->next )
           TY_(PPrintXMLTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag )
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl )
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag )
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag )
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag )
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( TY_(nodeHasCM)(node, CM_EMPTY) ||
              (node->type == StartEndTag && !xhtmlOut) )
    {
        PCondFlushLineSmart( doc, indent );
        PPrintTag( doc, mode, indent, node );
        /* TY_(PFlushLine)( doc, indent ); */
    }
    else /* some kind of container element */
    {
        uint spaces = cfg( doc, TidyIndentSpaces );
        Node *content;
        Bool mixed = no;
        uint cindent;

        for ( content = node->content; content; content = content->next )
        {
            if ( TY_(nodeIsText)(content) )
            {
                mixed = yes;
                break;
            }
        }

        PCondFlushLineSmart( doc, indent );

        if ( TY_(XMLPreserveWhiteSpace)(doc, node) )
        {
            indent = 0;
            mixed = no;
            cindent = 0;
        }
        else if (mixed)
            cindent = indent;
        else
            cindent = indent + spaces;

        PPrintTag( doc, mode, indent, node );
        if ( !mixed && node->content )
            TY_(PFlushLineSmart)( doc, cindent );
 
        for ( content = node->content; content; content = content->next )
            TY_(PPrintXMLTree)( doc, mode, cindent, content );

        if ( !mixed && node->content )
            PCondFlushLineSmart( doc, indent );

        PPrintEndTag( doc, mode, indent, node );
        /* PCondFlushLine( doc, indent ); */
    }
}